

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.hpp
# Opt level: O2

back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> __thiscall
pstore::diff_details::
traverser<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
::operator()(traverser<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
             *this,back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>
                   out)

{
  back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> bVar1;
  
  if ((*(index_pointer *)(*(long *)(this + 8) + 0x18)).internal_ != (internal_node *)0x0) {
    bVar1 = visit_node<std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                      (this,*(index_pointer *)(*(long *)(this + 8) + 0x18),0,out);
    return (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>)
           bVar1.container;
  }
  return (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>)
         (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>)
         out.container;
}

Assistant:

OutputIterator traverser<Index>::operator() (OutputIterator out) const {
            if (auto const root = index_.root ()) {
                out = this->visit_node (root, 0U, out);
            }
            return out;
        }